

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable_suite.cpp
# Opt level: O0

void ctor_suite::construct_map_with_nested_map(void)

{
  basic_variable<std::allocator<char>> *pbVar1;
  size_type in_RCX;
  initializer_list<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>
  init;
  basic_variable<std::allocator<char>_> *local_618;
  basic_variable<std::allocator<char>_> *local_600;
  basic_variable<std::allocator<char>_> *local_5e8;
  basic_variable<std::allocator<char>_> *local_5d0;
  basic_variable<std::allocator<char>_> *local_5a8;
  basic_variable<std::allocator<char>_> *local_590;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  *local_568;
  undefined1 local_559;
  basic_variable<std::allocator<char>_> local_558;
  undefined1 local_528 [2];
  undefined1 local_526;
  undefined1 local_525 [2];
  undefined1 local_523;
  undefined1 local_522;
  undefined1 local_521;
  basic_variable<std::allocator<char>_> *local_520;
  basic_variable<std::allocator<char>_> local_518;
  basic_variable<std::allocator<char>_> local_4e8;
  undefined1 auStack_4b8 [32];
  basic_variable<std::allocator<char>_> local_498;
  undefined1 auStack_468 [32];
  basic_variable<std::allocator<char>_> local_448;
  basic_variable<std::allocator<char>_> local_418;
  undefined1 auStack_3e8 [32];
  basic_variable<std::allocator<char>_> local_3c8;
  undefined1 local_398 [16];
  undefined1 local_388 [8];
  variable data_2;
  undefined1 local_349;
  basic_variable<std::allocator<char>_> local_348;
  undefined1 local_317 [2];
  undefined1 local_315;
  undefined1 local_314 [2];
  undefined1 local_312;
  undefined1 local_311;
  int local_310 [2];
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  local_308;
  basic_variable<std::allocator<char>_> *local_2a0;
  basic_variable<std::allocator<char>_> local_298;
  basic_variable<std::allocator<char>_> local_268;
  undefined1 auStack_238 [32];
  basic_variable<std::allocator<char>_> local_218;
  undefined1 local_1e8 [16];
  undefined1 local_1d8 [8];
  variable data_1;
  undefined1 local_199;
  basic_variable<std::allocator<char>_> local_198;
  undefined1 local_162 [2];
  undefined1 local_160;
  undefined1 local_15f [2];
  undefined1 local_15d;
  int local_150 [2];
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  local_148;
  basic_variable<std::allocator<char>_> local_e8;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  *local_b0;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  local_a8;
  undefined1 local_48 [16];
  undefined1 local_38 [8];
  variable data;
  
  local_15d = 1;
  local_b0 = &local_a8;
  local_150[1] = 1;
  local_150[0] = 2;
  std::
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::pair<int,_int,_true>(&local_148,local_150 + 1,local_150);
  trial::dynamic::basic_map<std::allocator<char>_>::make(&local_e8,&local_148);
  std::
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::pair<const_char_(&)[6],_trial::dynamic::basic_variable<std::allocator<char>_>,_true>
            (&local_a8,(char (*) [6])"alpha",&local_e8);
  local_15d = 0;
  local_48._0_8_ = &local_a8;
  local_48._8_8_ = 1;
  init._M_len = in_RCX;
  init._M_array = (iterator)0x1;
  trial::dynamic::basic_map<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)local_38,
             (basic_map<std::allocator<char>_> *)local_48._0_8_,init);
  local_568 = (pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
               *)local_48;
  do {
    local_568 = local_568 + -1;
    std::
    pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
    ::~pair(local_568);
  } while (local_568 != &local_a8);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_e8);
  std::
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::~pair(&local_148);
  local_15f[0] = trial::dynamic::basic_variable<std::allocator<char>>::
                 is<trial::dynamic::basic_map<std::allocator<char>>>
                           ((basic_variable<std::allocator<char>> *)local_38);
  local_160 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<map>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x180,"void ctor_suite::construct_map_with_nested_map()",local_15f,&local_160);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_198,"alpha");
  pbVar1 = (basic_variable<std::allocator<char>> *)
           trial::dynamic::basic_variable<std::allocator<char>_>::operator[]
                     ((basic_variable<std::allocator<char>_> *)local_38,&local_198);
  local_162[0] = trial::dynamic::basic_variable<std::allocator<char>>::
                 is<trial::dynamic::basic_map<std::allocator<char>>>(pbVar1);
  local_199 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data[\"alpha\"].is<map>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x181,"void ctor_suite::construct_map_with_nested_map()",local_162,&local_199);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_198);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_38);
  local_312 = 1;
  auStack_238._24_8_ = &local_218;
  local_311 = 1;
  local_2a0 = &local_298;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(local_2a0,"alpha");
  local_310[1] = 1;
  local_310[0] = 2;
  local_2a0 = &local_268;
  std::
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::pair<int,_int,_true>(&local_308,local_310 + 1,local_310);
  trial::dynamic::basic_map<std::allocator<char>_>::make(&local_268,&local_308);
  local_311 = 0;
  auStack_238._8_8_ = &local_298;
  auStack_238._16_8_ = 2;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            (&local_218,
             (initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> *)
             (auStack_238 + 8));
  local_312 = 0;
  local_1e8._0_8_ = &local_218;
  local_1e8._8_8_ = 1;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)local_1d8,
             (initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> *)local_1e8);
  local_590 = (basic_variable<std::allocator<char>_> *)local_1e8;
  do {
    local_590 = local_590 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_590);
  } while (local_590 != &local_218);
  local_5a8 = (basic_variable<std::allocator<char>_> *)auStack_238;
  do {
    local_5a8 = local_5a8 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_5a8);
  } while (local_5a8 != &local_298);
  std::
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::~pair(&local_308);
  local_314[0] = trial::dynamic::basic_variable<std::allocator<char>>::
                 is<trial::dynamic::basic_map<std::allocator<char>>>
                           ((basic_variable<std::allocator<char>> *)local_1d8);
  local_315 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<map>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x185,"void ctor_suite::construct_map_with_nested_map()",local_314,&local_315);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_348,"alpha");
  pbVar1 = (basic_variable<std::allocator<char>> *)
           trial::dynamic::basic_variable<std::allocator<char>_>::operator[]
                     ((basic_variable<std::allocator<char>_> *)local_1d8,&local_348);
  local_317[0] = trial::dynamic::basic_variable<std::allocator<char>>::
                 is<trial::dynamic::basic_map<std::allocator<char>>>(pbVar1);
  local_349 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data[\"alpha\"].is<map>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x186,"void ctor_suite::construct_map_with_nested_map()",local_317,&local_349);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_348);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_1d8);
  local_523 = 1;
  auStack_3e8._24_8_ = &local_3c8;
  local_522 = 1;
  auStack_468._24_8_ = &local_448;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)auStack_468._24_8_,"alpha");
  local_521 = 1;
  auStack_4b8._24_8_ = &local_498;
  local_520 = &local_518;
  auStack_468._24_8_ = &local_418;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_520,1);
  local_520 = &local_4e8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_520,2);
  auStack_4b8._8_8_ = &local_518;
  auStack_4b8._16_8_ = 2;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            (&local_498,
             (initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> *)
             (auStack_4b8 + 8));
  local_521 = 0;
  auStack_468._8_8_ = &local_498;
  auStack_468._16_8_ = 1;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            (&local_418,
             (initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> *)
             (auStack_468 + 8));
  local_522 = 0;
  auStack_3e8._8_8_ = &local_448;
  auStack_3e8._16_8_ = 2;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            (&local_3c8,
             (initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> *)
             (auStack_3e8 + 8));
  local_523 = 0;
  local_398._0_8_ = &local_3c8;
  local_398._8_8_ = 1;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)local_388,
             (initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> *)local_398);
  local_5d0 = (basic_variable<std::allocator<char>_> *)local_398;
  do {
    local_5d0 = local_5d0 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_5d0);
  } while (local_5d0 != &local_3c8);
  local_5e8 = (basic_variable<std::allocator<char>_> *)auStack_3e8;
  do {
    local_5e8 = local_5e8 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_5e8);
  } while (local_5e8 != &local_448);
  local_600 = (basic_variable<std::allocator<char>_> *)auStack_468;
  do {
    local_600 = local_600 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_600);
  } while (local_600 != &local_498);
  local_618 = (basic_variable<std::allocator<char>_> *)auStack_4b8;
  do {
    local_618 = local_618 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_618);
  } while (local_618 != &local_518);
  local_525[0] = trial::dynamic::basic_variable<std::allocator<char>>::
                 is<trial::dynamic::basic_map<std::allocator<char>>>
                           ((basic_variable<std::allocator<char>> *)local_388);
  local_526 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<map>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x18a,"void ctor_suite::construct_map_with_nested_map()",local_525,&local_526);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_558,"alpha");
  pbVar1 = (basic_variable<std::allocator<char>> *)
           trial::dynamic::basic_variable<std::allocator<char>_>::operator[]
                     ((basic_variable<std::allocator<char>_> *)local_388,&local_558);
  local_528[0] = trial::dynamic::basic_variable<std::allocator<char>>::
                 is<trial::dynamic::basic_map<std::allocator<char>>>(pbVar1);
  local_559 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data[\"alpha\"].is<map>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x18b,"void ctor_suite::construct_map_with_nested_map()",local_528,&local_559);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_558);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_388);
  return;
}

Assistant:

void construct_map_with_nested_map()
{
    {
        variable data(map::make({ {"alpha", map::make({1, 2})} }));
        TRIAL_PROTOCOL_TEST_EQUAL(data.is<map>(), true);
        TRIAL_PROTOCOL_TEST_EQUAL(data["alpha"].is<map>(), true);
    }
    {
        variable data({ {"alpha", map::make({1, 2})} });
        TRIAL_PROTOCOL_TEST_EQUAL(data.is<map>(), true);
        TRIAL_PROTOCOL_TEST_EQUAL(data["alpha"].is<map>(), true);
    }
    {
        variable data({ {"alpha", {{1, 2}} } });
        TRIAL_PROTOCOL_TEST_EQUAL(data.is<map>(), true);
        TRIAL_PROTOCOL_TEST_EQUAL(data["alpha"].is<map>(), true);
    }
}